

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

int nite::translateKey(string *key)

{
  bool bVar1;
  string local_38;
  string *local_18;
  string *key_local;
  
  local_18 = key;
  toUpper(&local_38,key);
  std::__cxx11::string::operator=((string *)key,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = std::operator==(key,"A");
  if (bVar1) {
    key_local._4_4_ = 0;
  }
  else {
    bVar1 = std::operator==(key,"B");
    if (bVar1) {
      key_local._4_4_ = 1;
    }
    else {
      bVar1 = std::operator==(key,"C");
      if (bVar1) {
        key_local._4_4_ = 2;
      }
      else {
        bVar1 = std::operator==(key,"D");
        if (bVar1) {
          key_local._4_4_ = 3;
        }
        else {
          bVar1 = std::operator==(key,"E");
          if (bVar1) {
            key_local._4_4_ = 4;
          }
          else {
            bVar1 = std::operator==(key,"F");
            if (bVar1) {
              key_local._4_4_ = 5;
            }
            else {
              bVar1 = std::operator==(key,"G");
              if (bVar1) {
                key_local._4_4_ = 6;
              }
              else {
                bVar1 = std::operator==(key,"H");
                if (bVar1) {
                  key_local._4_4_ = 7;
                }
                else {
                  bVar1 = std::operator==(key,"I");
                  if (bVar1) {
                    key_local._4_4_ = 8;
                  }
                  else {
                    bVar1 = std::operator==(key,"J");
                    if (bVar1) {
                      key_local._4_4_ = 9;
                    }
                    else {
                      bVar1 = std::operator==(key,"K");
                      if (bVar1) {
                        key_local._4_4_ = 10;
                      }
                      else {
                        bVar1 = std::operator==(key,"L");
                        if (bVar1) {
                          key_local._4_4_ = 0xb;
                        }
                        else {
                          bVar1 = std::operator==(key,"M");
                          if (bVar1) {
                            key_local._4_4_ = 0xc;
                          }
                          else {
                            bVar1 = std::operator==(key,"N");
                            if (bVar1) {
                              key_local._4_4_ = 0xd;
                            }
                            else {
                              bVar1 = std::operator==(key,"O");
                              if (bVar1) {
                                key_local._4_4_ = 0xe;
                              }
                              else {
                                bVar1 = std::operator==(key,"P");
                                if (bVar1) {
                                  key_local._4_4_ = 0xf;
                                }
                                else {
                                  bVar1 = std::operator==(key,"Q");
                                  if (bVar1) {
                                    key_local._4_4_ = 0x10;
                                  }
                                  else {
                                    bVar1 = std::operator==(key,"R");
                                    if (bVar1) {
                                      key_local._4_4_ = 0x11;
                                    }
                                    else {
                                      bVar1 = std::operator==(key,"S");
                                      if (bVar1) {
                                        key_local._4_4_ = 0x12;
                                      }
                                      else {
                                        bVar1 = std::operator==(key,"T");
                                        if (bVar1) {
                                          key_local._4_4_ = 0x13;
                                        }
                                        else {
                                          bVar1 = std::operator==(key,"U");
                                          if (bVar1) {
                                            key_local._4_4_ = 0x14;
                                          }
                                          else {
                                            bVar1 = std::operator==(key,"V");
                                            if (bVar1) {
                                              key_local._4_4_ = 0x15;
                                            }
                                            else {
                                              bVar1 = std::operator==(key,"W");
                                              if (bVar1) {
                                                key_local._4_4_ = 0x16;
                                              }
                                              else {
                                                bVar1 = std::operator==(key,"X");
                                                if (bVar1) {
                                                  key_local._4_4_ = 0x17;
                                                }
                                                else {
                                                  bVar1 = std::operator==(key,"Y");
                                                  if (bVar1) {
                                                    key_local._4_4_ = 0x18;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"Z");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0x19;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"0");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0x1a;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(key,"1");
                                                        if (bVar1) {
                                                          key_local._4_4_ = 0x1b;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(key,"2");
                                                          if (bVar1) {
                                                            key_local._4_4_ = 0x1c;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(key,"3");
                                                            if (bVar1) {
                                                              key_local._4_4_ = 0x1d;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(key,"4");
                                                              if (bVar1) {
                                                                key_local._4_4_ = 0x1e;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(key,"5");
                                                                if (bVar1) {
                                                                  key_local._4_4_ = 0x1f;
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(key,"6");
                                                                  if (bVar1) {
                                                                    key_local._4_4_ = 0x20;
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(key,"7")
                                                                    ;
                                                                    if (bVar1) {
                                                                      key_local._4_4_ = 0x21;
                                                                    }
                                                                    else {
                                                                      bVar1 = std::operator==(key,
                                                  "8");
                                                  if (bVar1) {
                                                    key_local._4_4_ = 0x22;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"9");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0x23;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"ESCAPE");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0x24;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(key,"LCONTROL");
                                                        if (bVar1) {
                                                          key_local._4_4_ = 0x25;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(key,"LSHIFT");
                                                          if (bVar1) {
                                                            key_local._4_4_ = 0x26;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(key,"LALT");
                                                            if (bVar1) {
                                                              key_local._4_4_ = 0x27;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(key,"LSYSTEM")
                                                              ;
                                                              if (bVar1) {
                                                                key_local._4_4_ = 0x28;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(key,
                                                  "RCONTROL");
                                                  if (bVar1) {
                                                    key_local._4_4_ = 0x29;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"RSHIFT");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0x2a;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"RALT");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0x2b;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(key,"RSYSTEM");
                                                        if (bVar1) {
                                                          key_local._4_4_ = 0x2c;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(key,"MENU");
                                                          if (bVar1) {
                                                            key_local._4_4_ = 0x2d;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(key,"LBRACKET");
                                                            if (bVar1) {
                                                              key_local._4_4_ = 0x2e;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(key,"RBRACKET"
                                                                                     );
                                                              if (bVar1) {
                                                                key_local._4_4_ = 0x2f;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(key,
                                                  "SEMICOLON");
                                                  if (bVar1) {
                                                    key_local._4_4_ = 0x30;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"COMMA");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0x31;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"PERIOD");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0x32;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(key,"QUOTE");
                                                        if (bVar1) {
                                                          key_local._4_4_ = 0x33;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(key,"SLASH");
                                                          if (bVar1) {
                                                            key_local._4_4_ = 0x34;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(key,"BACKSLASH")
                                                            ;
                                                            if (bVar1) {
                                                              key_local._4_4_ = 0x35;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(key,"TILDE");
                                                              if (bVar1) {
                                                                key_local._4_4_ = 0x36;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(key,"EQUAL")
                                                                ;
                                                                if (bVar1) {
                                                                  key_local._4_4_ = 0x37;
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(key,"DASH"
                                                                                         );
                                                                  if (bVar1) {
                                                                    key_local._4_4_ = 0x38;
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(key,
                                                  "SPACE");
                                                  if (bVar1) {
                                                    key_local._4_4_ = 0x39;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"ENTER");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0x3a;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"BACK");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0x3b;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(key,"PAGEUP");
                                                        if (bVar1) {
                                                          key_local._4_4_ = 0x3d;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(key,"PAGEDOWN");
                                                          if (bVar1) {
                                                            key_local._4_4_ = 0x3e;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(key,"END");
                                                            if (bVar1) {
                                                              key_local._4_4_ = 0x3f;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(key,"HOME");
                                                              if (bVar1) {
                                                                key_local._4_4_ = 0x40;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(key,"INSERT"
                                                                                       );
                                                                if (bVar1) {
                                                                  key_local._4_4_ = 0x41;
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(key,
                                                  "DELETE");
                                                  if (bVar1) {
                                                    key_local._4_4_ = 0x42;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"ADD");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0x43;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"SUBTRACT");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0x44;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(key,"MULTIPLY");
                                                        if (bVar1) {
                                                          key_local._4_4_ = 0x45;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(key,"DIVIDE");
                                                          if (bVar1) {
                                                            key_local._4_4_ = 0x46;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(key,"LEFT");
                                                            if (bVar1) {
                                                              key_local._4_4_ = 0x47;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(key,"RIGHT");
                                                              if (bVar1) {
                                                                key_local._4_4_ = 0x48;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(key,"UP");
                                                                if (bVar1) {
                                                                  key_local._4_4_ = 0x49;
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(key,"DOWN"
                                                                                         );
                                                                  if (bVar1) {
                                                                    key_local._4_4_ = 0x4a;
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(key,
                                                  "NUMPAD0");
                                                  if (bVar1) {
                                                    key_local._4_4_ = 0x4b;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"NUMPAD1");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0x4c;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"NUMPAD2");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0x4d;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(key,"NUMPAD3");
                                                        if (bVar1) {
                                                          key_local._4_4_ = 0x4e;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(key,"NUMPAD4");
                                                          if (bVar1) {
                                                            key_local._4_4_ = 0x4f;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(key,"NUMPAD5");
                                                            if (bVar1) {
                                                              key_local._4_4_ = 0x50;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(key,"NUMPAD6")
                                                              ;
                                                              if (bVar1) {
                                                                key_local._4_4_ = 0x51;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(key,
                                                  "NUMPAD7");
                                                  if (bVar1) {
                                                    key_local._4_4_ = 0x52;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"NUMPAD8");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0x53;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"NUMPAD9");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0x54;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(key,"F1");
                                                        if (bVar1) {
                                                          key_local._4_4_ = 0x55;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(key,"F2");
                                                          if (bVar1) {
                                                            key_local._4_4_ = 0x56;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(key,"F3");
                                                            if (bVar1) {
                                                              key_local._4_4_ = 0x57;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(key,"F4");
                                                              if (bVar1) {
                                                                key_local._4_4_ = 0x58;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(key,"F5");
                                                                if (bVar1) {
                                                                  key_local._4_4_ = 0x59;
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(key,"F6");
                                                                  if (bVar1) {
                                                                    key_local._4_4_ = 0x5a;
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(key,"F7"
                                                  );
                                                  if (bVar1) {
                                                    key_local._4_4_ = 0x5b;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"F8");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0x5c;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"F9");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0x5d;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(key,"F10");
                                                        if (bVar1) {
                                                          key_local._4_4_ = 0x5e;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(key,"F11");
                                                          if (bVar1) {
                                                            key_local._4_4_ = 0x5f;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(key,"F12");
                                                            if (bVar1) {
                                                              key_local._4_4_ = 0x60;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(key,"F14");
                                                              if (bVar1) {
                                                                key_local._4_4_ = 0x62;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(key,"F14");
                                                                if (bVar1) {
                                                                  key_local._4_4_ = 0x62;
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(key,"F15")
                                                                  ;
                                                                  if (bVar1) {
                                                                    key_local._4_4_ = 99;
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(key,
                                                  "PAUSE");
                                                  if (bVar1) {
                                                    key_local._4_4_ = 100;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(key,"M1");
                                                    if (bVar1) {
                                                      key_local._4_4_ = 0xc9;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(key,"M2");
                                                      if (bVar1) {
                                                        key_local._4_4_ = 0xcb;
                                                      }
                                                      else {
                                                        key_local._4_4_ = -1;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return key_local._4_4_;
}

Assistant:

int nite::translateKey(String key){
	key = nite::toUpper(key);
	if(key == "A"){return nite::keyA;} else if(key == "B"){return nite::keyB;} else if(key == "C"){return nite::keyC;} else if(key == "D"){return nite::keyD;} else if(key == "E"){return nite::keyE;} else
	if(key == "F"){return nite::keyF;} else if(key == "G"){return nite::keyG;} else if(key == "H"){return nite::keyH;} else if(key == "I"){return nite::keyI;} else if(key == "J"){return nite::keyJ;} else
	if(key == "K"){return nite::keyK;} else if(key == "L"){return nite::keyL;} else if(key == "M"){return nite::keyM;} else if(key == "N"){return nite::keyN;} else if(key == "O"){return nite::keyO;} else
	if(key == "P"){return nite::keyP;} else if(key == "Q"){return nite::keyQ;} else if(key == "R"){return nite::keyR;} else if(key == "S"){return nite::keyS;} else if(key == "T"){return nite::keyT;} else
	if(key == "U"){return nite::keyU;} else if(key == "V"){return nite::keyV;} else if(key == "W"){return nite::keyW;} else if(key == "X"){return nite::keyX;} else if(key == "Y"){return nite::keyY;} else
	if(key == "Z"){return nite::keyZ;} else if(key == "0"){return nite::key0;} else if(key == "1"){return nite::key1;} else if(key == "2"){return nite::key2;} else if(key == "3"){return nite::key3;} else
	if(key == "4"){return nite::key4;} else if(key == "5"){return nite::key5;} else if(key == "6"){return nite::key6;} else if(key == "7"){return nite::key7;} else if(key == "8"){return nite::key8;} else
	if(key == "9"){return nite::key9;} else if(key == "ESCAPE"){return nite::keyESCAPE;} else if(key == "LCONTROL"){return nite::keyLCONTROL;} else if(key == "LSHIFT"){return nite::keyLSHIFT;} else
	if(key == "LALT"){return nite::keyLALT;} else if(key == "LSYSTEM"){return nite::keyLSYSTEM;} else if(key == "RCONTROL"){return nite::keyRCONTROL;} else if(key == "RSHIFT"){return nite::keyRSHIFT;} else
	if(key == "RALT"){return nite::keyRALT;} else if(key == "RSYSTEM"){return nite::keyRSYSTEM;} else if(key == "MENU"){return nite::keyMENU;} else if(key == "LBRACKET"){return nite::keyLBRACKET;} else
	if(key == "RBRACKET"){return nite::keyRBRACKET;} else if(key == "SEMICOLON"){return nite::keySEMICOLON;} else if(key == "COMMA"){return nite::keyCOMMA;} else if(key == "PERIOD"){return nite::keyPERIOD;} else
	if(key == "QUOTE"){return nite::keyQUOTE;} else if(key == "SLASH"){return nite::keySLASH;} else if(key == "BACKSLASH"){return nite::keyBACKSLASH;} else if(key == "TILDE"){return nite::keyTILDE;} else
	if(key == "EQUAL"){return nite::keyEQUAL;} else if(key == "DASH"){return nite::keyDASH;} else if(key == "SPACE"){return nite::keySPACE;} else if(key == "ENTER"){return nite::keyENTER;} else
	if(key == "BACK"){return nite::keyBACK;} else if(key == "PAGEUP"){return nite::keyPAGEUP;} else if(key == "PAGEDOWN"){return nite::keyPAGEDOWN;} else if(key == "END"){return nite::keyEND;} else
	if(key == "HOME"){return nite::keyHOME;} else if(key == "INSERT"){return nite::keyINSERT;} else if(key == "DELETE"){return nite::keyDELETE;} else if(key == "ADD"){return nite::keyADD;} else
	if(key == "SUBTRACT"){return nite::keySUBTRACT;} else if(key == "MULTIPLY"){return nite::keyMULTIPLY;} else if(key == "DIVIDE"){return nite::keyDIVIDE;} else if(key == "LEFT"){return nite::keyLEFT;} else
	if(key == "RIGHT"){return nite::keyRIGHT;} else if(key == "UP"){return nite::keyUP;} else if(key == "DOWN"){return nite::keyDOWN;} else if(key == "NUMPAD0"){return nite::keyNUMPAD0;} else
	if(key == "NUMPAD1"){return nite::keyNUMPAD1;} else if(key == "NUMPAD2"){return nite::keyNUMPAD2;} else if(key == "NUMPAD3"){return nite::keyNUMPAD3;} else if(key == "NUMPAD4"){return nite::keyNUMPAD4;} else
	if(key == "NUMPAD5"){return nite::keyNUMPAD5;} else if(key == "NUMPAD6"){return nite::keyNUMPAD6;} else if(key == "NUMPAD7"){return nite::keyNUMPAD7;} else if(key == "NUMPAD8"){return nite::keyNUMPAD8;} else
	if(key == "NUMPAD9"){return nite::keyNUMPAD9;} else if(key == "F1"){return nite::keyF1;} else if(key == "F2"){return nite::keyF2;} else if(key == "F3"){return nite::keyF3;} else if(key == "F4"){return nite::keyF4;} else
	if(key == "F5"){return nite::keyF5;} else if(key == "F6"){return nite::keyF6;} else if(key == "F7"){return nite::keyF7;} else if(key == "F8"){return nite::keyF8;} else if(key == "F9"){return nite::keyF9;} else
	if(key == "F10"){return nite::keyF10;} else if(key == "F11"){return nite::keyF11;} else if(key == "F12"){return nite::keyF12;} else if(key == "F14"){return nite::keyF14;} else if(key == "F14"){return nite::keyF14;} else
	if(key == "F15"){return nite::keyF15;} else if(key == "PAUSE"){return nite::keyPAUSE;}else
	if(key == "M1"){ return nite::butLEFT; } else if(key == "M2"){ return nite::butRIGHT; } else
	return -1;
}